

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::AddGalacticPars(CEExecOptions *this)

{
  double in_RDI;
  allocator *paVar1;
  string *in_stack_ffffffffffffff48;
  CLOptions *in_stack_ffffffffffffff50;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  paVar1 = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"l,glon",paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Galactic longitude (degrees)",&local_61);
  CLOptions::AddDoubleParam
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(string *)paVar1,in_RDI);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"b,glat",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff50,"Galactic latitude (degrees)",
             (allocator *)&stack0xffffffffffffff4f);
  CLOptions::AddDoubleParam
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(string *)paVar1,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

inline
void CEExecOptions::AddGalacticPars(void)
{
    AddDoubleParam("l,glon", "Galactic longitude (degrees)", 0.0);
    AddDoubleParam("b,glat", "Galactic latitude (degrees)", 0.0);
}